

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O2

void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 != 0) {
    return;
  }
  Abc_NodeSetTravIdCurrent(pObj);
  uVar2 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar2 != 2) && (uVar2 != 5)) {
    if (uVar2 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                    ,0x39,"void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    for (lVar3 = 0; lVar3 < (pObj->vFanins).nSize; lVar3 = lVar3 + 1) {
      Abc_MfsWinMarkTfi_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar3]],vCone);
    }
  }
  Vec_PtrPush(vCone,pObj);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks and collects the TFI cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_MfsWinMarkTfi_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_MfsWinMarkTfi_rec( pFanin, vCone );
    Vec_PtrPush( vCone, pObj );
}